

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

LexerState * lexer_OpenFile(char *path)

{
  int iVar1;
  LexerState *state;
  int *piVar2;
  char *pcVar3;
  char *fmt;
  bool bVar4;
  stat fileInfo;
  
  bVar4 = true;
  if (*path == '-') {
    bVar4 = path[1] != '\0';
  }
  state = (LexerState *)malloc(0xb8);
  if (state == (LexerState *)0x0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    error("Failed to allocate memory for lexer state: %s\n",pcVar3);
    return (LexerState *)0x0;
  }
  if (bVar4) {
    iVar1 = stat(path,(stat *)&fileInfo);
    if (iVar1 == 0) {
      state->path = path;
      state->isFile = true;
      iVar1 = open(path,0);
      (state->field_2).field_1.fd = iVar1;
      if (-1 < iVar1) {
        state->isMmapped = false;
        if (fileInfo.st_size < 1) {
LAB_0010bea9:
          if (verbose != false) {
            if (!bVar4) goto LAB_0010bd83;
            if (fileInfo.st_size == 0) {
              printf("File %s is empty\n",path);
            }
            else {
              piVar2 = __errno_location();
              pcVar3 = strerror(*piVar2);
              printf("File %s opened as regular, errno reports \"%s\"\n",path,pcVar3);
            }
          }
          goto LAB_0010bd8f;
        }
        pcVar3 = (char *)mmap((void *)0x0,fileInfo.st_size,1,2,iVar1,0);
        if (pcVar3 == (char *)0xffffffffffffffff) {
          piVar2 = __errno_location();
          if (*piVar2 == 0x5f) {
            if (verbose == true) {
              printf("mmap(%s, MAP_PRIVATE) failed, retrying with MAP_SHARED\n",path);
            }
            pcVar3 = (char *)mmap((void *)0x0,fileInfo.st_size,1,1,(state->field_2).field_1.fd,0);
            if (pcVar3 != (char *)0xffffffffffffffff) goto LAB_0010be00;
          }
          state->isMmapped = false;
          goto LAB_0010bea9;
        }
LAB_0010be00:
        close((state->field_2).field_1.fd);
        state->isMmapped = true;
        (state->field_2).field_0.isReferenced = false;
        (state->field_2).field_0.ptr = pcVar3;
        (state->field_2).field_0.size = fileInfo.st_size;
        (state->field_2).field_0.offset = 0;
        if (verbose == true) {
          printf("File %s successfully mmap()ped\n",path);
        }
        goto LAB_0010bd99;
      }
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      fmt = "Failed to open file \"%s\": %s\n";
    }
    else {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      fmt = "Failed to stat file \"%s\": %s\n";
    }
    error(fmt,path,pcVar3);
    free(state);
    state = (LexerState *)0x0;
  }
  else {
    state->path = "<stdin>";
    state->isFile = true;
    (state->field_2).field_1.fd = 0;
    state->isMmapped = false;
    if (verbose != false) {
LAB_0010bd83:
      puts("Opening stdin");
    }
LAB_0010bd8f:
    (state->field_2).field_0.size = 0;
    (state->field_2).field_1.nbChars = 0;
LAB_0010bd99:
    initState(state);
    state->lineNo = 0;
  }
  return state;
}

Assistant:

struct LexerState *lexer_OpenFile(char const *path)
{
	bool isStdin = !strcmp(path, "-");
	struct LexerState *state = (struct LexerState *)malloc(sizeof(*state));
	struct stat fileInfo;

	// Give stdin a nicer file name
	if (isStdin)
		path = "<stdin>";
	if (!state) {
		error("Failed to allocate memory for lexer state: %s\n", strerror(errno));
		return NULL;
	}
	if (!isStdin && stat(path, &fileInfo) != 0) {
		error("Failed to stat file \"%s\": %s\n", path, strerror(errno));
		free(state);
		return NULL;
	}
	state->path = path;
	state->isFile = true;
	state->fd = isStdin ? STDIN_FILENO : open(path, O_RDONLY);
	if (state->fd < 0) {
		error("Failed to open file \"%s\": %s\n", path, strerror(errno));
		free(state);
		return NULL;
	}
	state->isMmapped = false; // By default, assume it won't be mmap()ed
	if (!isStdin && fileInfo.st_size > 0) {
		// Try using `mmap` for better performance

		// Important: do NOT assign to `state->ptr` directly, to avoid a cast that may
		// alter an eventual `MAP_FAILED` value. It would also invalidate `state->fd`,
		// being on the other side of the union.
		void *mappingAddr;

		mapFile(mappingAddr, state->fd, state->path, fileInfo.st_size);
		if (mappingAddr == MAP_FAILED) {
			// If mmap()ing failed, try again using another method (below)
			state->isMmapped = false;
		} else {
			// IMPORTANT: the `union` mandates this is accessed before other members!
			close(state->fd);

			state->isMmapped = true;
			state->isReferenced = false; // By default, a state isn't referenced
			state->ptr = (char *)mappingAddr;
			assert(fileInfo.st_size >= 0);
			state->size = (size_t)fileInfo.st_size;
			state->offset = 0;

			if (verbose)
				printf("File %s successfully mmap()ped\n", path);
		}
	}
	if (!state->isMmapped) {
		// Sometimes mmap() fails or isn't available, so have a fallback
		if (verbose) {
			if (isStdin)
				printf("Opening stdin\n");
			else if (fileInfo.st_size == 0)
				printf("File %s is empty\n", path);
			else
				printf("File %s opened as regular, errno reports \"%s\"\n",
				       path, strerror(errno));
		}
		state->index = 0;
		state->nbChars = 0;
	}

	initState(state);
	state->lineNo = 0; // Will be incremented at first line start
	return state;
}